

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpFactoredForm(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int iVar1;
  char *pcVar2;
  uint local_48;
  int local_44;
  int i;
  int retval;
  FILE *fp_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  int n_local;
  DdManager *dd_local;
  
  local_48 = 0;
  do {
    if (n <= (int)local_48) {
      return 1;
    }
    if (onames == (char **)0x0) {
      local_44 = fprintf((FILE *)fp,"f%d = ",(ulong)local_48);
    }
    else {
      local_44 = fprintf((FILE *)fp,"%s = ",onames[(int)local_48]);
    }
    if (local_44 == -1) {
      return 0;
    }
    if (f[(int)local_48] == dd->one) {
      iVar1 = fprintf((FILE *)fp,"CONST1");
      if (iVar1 == -1) {
        return 0;
      }
    }
    else if ((f[(int)local_48] == (DdNode *)((ulong)dd->one ^ 1)) || (f[(int)local_48] == dd->zero))
    {
      iVar1 = fprintf((FILE *)fp,"CONST0");
      if (iVar1 == -1) {
        return 0;
      }
    }
    else {
      pcVar2 = "";
      if (((ulong)f[(int)local_48] & 1) != 0) {
        pcVar2 = "!(";
      }
      iVar1 = fprintf((FILE *)fp,"%s",pcVar2);
      if (iVar1 == -1) {
        return 0;
      }
      iVar1 = ddDoDumpFactoredForm
                        (dd,(DdNode *)((ulong)f[(int)local_48] & 0xfffffffffffffffe),fp,inames);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar2 = "";
      if (((ulong)f[(int)local_48] & 1) != 0) {
        pcVar2 = ")";
      }
      iVar1 = fprintf((FILE *)fp,"%s",pcVar2);
      if (iVar1 == -1) {
        return 0;
      }
    }
    pcVar2 = "\n";
    if (local_48 == n - 1U) {
      pcVar2 = "";
    }
    iVar1 = fprintf((FILE *)fp,"%s",pcVar2);
    if (iVar1 == -1) {
      return 0;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

int
Cudd_DumpFactoredForm(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    int         retval;
    int         i;

    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp, "f%d = ", i);
        } else {
            retval = fprintf(fp, "%s = ", onames[i]);
        }
        if (retval == EOF) return(0);
        if (f[i] == DD_ONE(dd)) {
            retval = fprintf(fp, "CONST1");
            if (retval == EOF) return(0);
        } else if (f[i] == Cudd_Not(DD_ONE(dd)) || f[i] == DD_ZERO(dd)) {
            retval = fprintf(fp, "CONST0");
            if (retval == EOF) return(0);
        } else {
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? "!(" : "");
            if (retval == EOF) return(0);
            retval = ddDoDumpFactoredForm(dd,Cudd_Regular(f[i]),fp,inames);
            if (retval == 0) return(0);
            retval = fprintf(fp, "%s", Cudd_IsComplement(f[i]) ? ")" : "");
            if (retval == EOF) return(0);
        }
        retval = fprintf(fp, "%s", i == n-1 ? "" : "\n");
        if (retval == EOF) return(0);
    }

    return(1);

}